

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

int linsolve_wiener(int n,int64_t *A,int stride,int64_t *b,int64_t *x)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  long lVar3;
  int j_1;
  int64_t *piVar4;
  ulong uVar5;
  sbyte sVar6;
  int64_t *piVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int j_2;
  int64_t *piVar15;
  sbyte sVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  int64_t *local_98;
  
  uVar11 = n - 1;
  if (1 < n) {
    uVar20 = (ulong)(uint)n;
    lVar14 = uVar20 - 1;
    lVar18 = (long)stride;
    local_98 = A + lVar18;
    uVar19 = 0;
    piVar4 = A + lVar14 * lVar18;
    piVar7 = A + (uVar20 - 2) * lVar18;
    lVar9 = lVar14;
    piVar15 = A;
    do {
      do {
        lVar10 = lVar9 + -1;
        uVar12 = A[uVar19 + lVar10 * lVar18];
        uVar5 = -uVar12;
        if (0 < (long)uVar12) {
          uVar5 = uVar12;
        }
        uVar12 = A[uVar19 + lVar9 * lVar18];
        uVar13 = -uVar12;
        if (0 < (long)uVar12) {
          uVar13 = uVar12;
        }
        if (uVar5 < uVar13) {
          uVar12 = 0;
          do {
            iVar2 = piVar4[uVar12];
            piVar4[uVar12] = piVar7[uVar12];
            piVar7[uVar12] = iVar2;
            uVar12 = uVar12 + 1;
          } while (uVar20 != uVar12);
          auVar1 = *(undefined1 (*) [16])(b + lVar10);
          auVar22._0_8_ = auVar1._8_8_;
          auVar22._8_4_ = auVar1._0_4_;
          auVar22._12_4_ = auVar1._4_4_;
          *(undefined1 (*) [16])(b + lVar10) = auVar22;
        }
        piVar4 = piVar4 + -lVar18;
        piVar7 = piVar7 + -lVar18;
        lVar9 = lVar10;
      } while ((long)uVar19 < lVar10);
      uVar5 = 0;
      uVar12 = 0;
      do {
        uVar13 = piVar15[uVar5];
        uVar8 = -uVar13;
        if (0 < (long)uVar13) {
          uVar8 = uVar13;
        }
        if ((long)uVar8 <= (long)uVar12) {
          uVar8 = uVar12;
        }
        uVar5 = uVar5 + 1;
        uVar12 = uVar8;
      } while (uVar20 != uVar5);
      bVar21 = uVar8 < 0x400000;
      lVar9 = 0x80;
      if (bVar21) {
        lVar9 = 1;
      }
      lVar10 = 0x40;
      if (bVar21) {
        lVar10 = 1;
      }
      sVar16 = 0xd;
      if (bVar21) {
        sVar16 = 0;
      }
      sVar6 = 7;
      piVar4 = local_98;
      uVar12 = uVar19;
      if (bVar21) {
        sVar6 = 0;
      }
      do {
        lVar17 = A[(uint)((stride + 1) * (int)uVar19)];
        if (lVar17 == 0) {
          return 0;
        }
        uVar12 = uVar12 + 1;
        lVar3 = A[uVar19 + uVar12 * lVar18];
        uVar5 = 0;
        do {
          piVar4[uVar5] =
               piVar4[uVar5] - (((piVar15[uVar5] / lVar10) * (lVar3 / lVar9)) / lVar17 << sVar16);
          uVar5 = uVar5 + 1;
        } while (uVar20 != uVar5);
        b[uVar12] = b[uVar12] - ((b[uVar19] * (lVar3 / lVar9)) / lVar17 << sVar6);
        piVar4 = piVar4 + lVar18;
      } while (uVar12 != uVar11);
      uVar19 = uVar19 + 1;
      piVar15 = piVar15 + lVar18;
      local_98 = local_98 + lVar18;
      piVar4 = A + lVar14 * lVar18;
      piVar7 = A + (uVar20 - 2) * lVar18;
      lVar9 = lVar14;
    } while (uVar19 != uVar11);
  }
  if (n < 1) {
    uVar19 = (ulong)uVar11;
  }
  else {
    uVar20 = (ulong)uVar11;
    lVar14 = (long)A + ((ulong)(uint)stride * 8 + 8) * uVar20 + 8;
    piVar4 = x + uVar20 + 1;
    uVar19 = uVar20;
    do {
      if (A[uVar19 + (uint)((int)uVar19 * stride)] == 0) goto LAB_00203af2;
      if ((long)uVar19 < (long)uVar20) {
        lVar18 = 0;
        lVar9 = 0;
        do {
          lVar17 = piVar4[lVar18] * *(long *)(lVar14 + lVar18 * 8);
          lVar10 = lVar17 + 0xffff;
          if (-1 < lVar17) {
            lVar10 = lVar17;
          }
          lVar9 = lVar9 + (lVar10 >> 0x10);
          lVar18 = lVar18 + 1;
        } while ((int)uVar19 + (int)lVar18 < (int)uVar11);
      }
      else {
        lVar9 = 0;
      }
      x[uVar19] = ((b[uVar19] - lVar9) * 0x10000) / A[uVar19 + (uint)((int)uVar19 * stride)];
      lVar14 = lVar14 + ((ulong)(uint)stride << 3 ^ 0xfffffffffffffff8);
      piVar4 = piVar4 + -1;
      bVar21 = 0 < (long)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar21);
    uVar19 = 0xffffffff;
  }
LAB_00203af2:
  return (uint)(uVar19 >> 0x1f) & 1;
}

Assistant:

static int linsolve_wiener(int n, int64_t *A, int stride, int64_t *b,
                           int64_t *x) {
  for (int k = 0; k < n - 1; k++) {
    // Partial pivoting: bring the row with the largest pivot to the top
    for (int i = n - 1; i > k; i--) {
      // If row i has a better (bigger) pivot than row (i-1), swap them
      if (llabs(A[(i - 1) * stride + k]) < llabs(A[i * stride + k])) {
        for (int j = 0; j < n; j++) {
          const int64_t c = A[i * stride + j];
          A[i * stride + j] = A[(i - 1) * stride + j];
          A[(i - 1) * stride + j] = c;
        }
        const int64_t c = b[i];
        b[i] = b[i - 1];
        b[i - 1] = c;
      }
    }

    // b/278065963: The multiplies
    //   c / 256 * A[k * stride + j] / cd * 256
    // and
    //   c / 256 * b[k] / cd * 256
    // within Gaussian elimination can cause a signed integer overflow. Rework
    // the multiplies so that larger scaling is used without significantly
    // impacting the overall precision.
    //
    // Precision guidance:
    //   scale_threshold: Pick as high as possible.
    // For max_abs_akj >= scale_threshold scenario:
    //   scaler_A: Pick as low as possible. Needed for A[(i + 1) * stride + j].
    //   scaler_c: Pick as low as possible while maintaining scaler_c >=
    //     (1 << 7). Needed for A[(i + 1) * stride + j] and b[i + 1].
    int64_t max_abs_akj = 0;
    for (int j = 0; j < n; j++) {
      const int64_t abs_akj = llabs(A[k * stride + j]);
      if (abs_akj > max_abs_akj) max_abs_akj = abs_akj;
    }
    const int scale_threshold = 1 << 22;
    const int scaler_A = max_abs_akj < scale_threshold ? 1 : (1 << 6);
    const int scaler_c = max_abs_akj < scale_threshold ? 1 : (1 << 7);
    const int scaler = scaler_c * scaler_A;

    // Forward elimination (convert A to row-echelon form)
    for (int i = k; i < n - 1; i++) {
      if (A[k * stride + k] == 0) return 0;
      const int64_t c = A[(i + 1) * stride + k] / scaler_c;
      const int64_t cd = A[k * stride + k];
      for (int j = 0; j < n; j++) {
        A[(i + 1) * stride + j] -=
            A[k * stride + j] / scaler_A * c / cd * scaler;
      }
      b[i + 1] -= c * b[k] / cd * scaler_c;
    }
  }
  // Back-substitution
  for (int i = n - 1; i >= 0; i--) {
    if (A[i * stride + i] == 0) return 0;
    int64_t c = 0;
    for (int j = i + 1; j <= n - 1; j++) {
      c += A[i * stride + j] * x[j] / WIENER_TAP_SCALE_FACTOR;
    }
    // Store filter taps x in scaled form.
    x[i] = WIENER_TAP_SCALE_FACTOR * (b[i] - c) / A[i * stride + i];
  }

  return 1;
}